

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_null_callback(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  undefined8 unaff_RBX;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t handle;
  undefined1 auStack_1c8 [120];
  code *pcStack_150;
  uint64_t uStack_140;
  code *pcStack_138;
  long lStack_128;
  long lStack_120;
  undefined1 auStack_118 [120];
  code *pcStack_a0;
  long local_90;
  long local_88;
  undefined1 local_80 [120];
  
  pcStack_a0 = (code *)0x1d74d8;
  uVar2 = uv_default_loop();
  pcStack_a0 = (code *)0x1d74e5;
  iVar1 = uv_timer_init(uVar2,local_80);
  local_88 = (long)iVar1;
  local_90 = 0;
  if (local_88 == 0) {
    local_88 = -0x16;
    pcStack_a0 = (code *)0x1d7524;
    iVar1 = uv_timer_start(local_80,0,100,100);
    local_90 = (long)iVar1;
    if (local_88 != local_90) goto LAB_001d75a2;
    pcStack_a0 = (code *)0x1d753c;
    unaff_RBX = uv_default_loop();
    pcStack_a0 = (code *)0x1d7550;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_a0 = (code *)0x1d755a;
    uv_run(unaff_RBX,0);
    local_88 = 0;
    pcStack_a0 = (code *)0x1d7568;
    uVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1d7570;
    iVar1 = uv_loop_close(uVar2);
    local_90 = (long)iVar1;
    if (local_88 == local_90) {
      pcStack_a0 = (code *)0x1d7588;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_a0 = (code *)0x1d75a2;
    run_test_timer_null_callback_cold_1();
LAB_001d75a2:
    pcStack_a0 = (code *)0x1d75b1;
    run_test_timer_null_callback_cold_2();
  }
  pcStack_a0 = run_test_timer_early_check;
  run_test_timer_null_callback_cold_3();
  pcStack_138 = (code *)0x1d75cd;
  pcStack_a0 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_138 = (code *)0x1d75d5;
  lVar3 = uv_now(uVar2);
  timer_early_check_expected_time = lVar3 + 10;
  pcStack_138 = (code *)0x1d75e5;
  uVar2 = uv_default_loop();
  pcStack_138 = (code *)0x1d75f2;
  iVar1 = uv_timer_init(uVar2,auStack_118);
  lStack_120 = (long)iVar1;
  lStack_128 = 0;
  if (lStack_120 == 0) {
    pcStack_138 = (code *)0x1d762a;
    iVar1 = uv_timer_start(auStack_118,timer_early_check_cb,10,0);
    lStack_120 = (long)iVar1;
    lStack_128 = 0;
    if (lStack_120 != 0) goto LAB_001d771f;
    pcStack_138 = (code *)0x1d764f;
    uVar2 = uv_default_loop();
    pcStack_138 = (code *)0x1d7659;
    iVar1 = uv_run(uVar2,0);
    lStack_120 = (long)iVar1;
    lStack_128 = 0;
    if (lStack_120 != 0) goto LAB_001d772e;
    pcStack_138 = (code *)0x1d7685;
    uv_close(auStack_118,0);
    pcStack_138 = (code *)0x1d768a;
    uVar2 = uv_default_loop();
    pcStack_138 = (code *)0x1d7694;
    iVar1 = uv_run(uVar2,0);
    lStack_120 = (long)iVar1;
    lStack_128 = 0;
    if (lStack_120 != 0) goto LAB_001d773d;
    pcStack_138 = (code *)0x1d76b9;
    unaff_RBX = uv_default_loop();
    pcStack_138 = (code *)0x1d76cd;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_138 = (code *)0x1d76d7;
    uv_run(unaff_RBX,0);
    lStack_120 = 0;
    pcStack_138 = (code *)0x1d76e5;
    uVar2 = uv_default_loop();
    pcStack_138 = (code *)0x1d76ed;
    iVar1 = uv_loop_close(uVar2);
    lStack_128 = (long)iVar1;
    if (lStack_120 == lStack_128) {
      pcStack_138 = (code *)0x1d7705;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_138 = (code *)0x1d771f;
    run_test_timer_early_check_cold_1();
LAB_001d771f:
    pcStack_138 = (code *)0x1d772e;
    run_test_timer_early_check_cold_2();
LAB_001d772e:
    pcStack_138 = (code *)0x1d773d;
    run_test_timer_early_check_cold_3();
LAB_001d773d:
    pcStack_138 = (code *)0x1d774c;
    run_test_timer_early_check_cold_4();
  }
  pcStack_138 = timer_early_check_cb;
  run_test_timer_early_check_cold_5();
  pcStack_150 = (code *)0x1d7764;
  uVar4 = uv_hrtime();
  pcStack_138 = (code *)(uVar4 / 1000000);
  uStack_140 = timer_early_check_expected_time;
  if ((long)timer_early_check_expected_time <= (long)pcStack_138) {
    return (int)pcStack_138;
  }
  pcStack_150 = run_test_timer_no_double_call_once;
  timer_early_check_cb_cold_1();
  pcStack_150 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_1c8);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_1c8,timer_check_double_call,10,10);
    if (iVar1 != 0) goto LAB_001d78e7;
    uv_sleep(0x14);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 1) goto LAB_001d78f6;
    if (timer_check_double_call_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d7914;
    }
  }
  else {
    run_test_timer_no_double_call_once_cold_1();
LAB_001d78e7:
    run_test_timer_no_double_call_once_cold_2();
LAB_001d78f6:
    run_test_timer_no_double_call_once_cold_3();
  }
  run_test_timer_no_double_call_once_cold_4();
LAB_001d7914:
  run_test_timer_no_double_call_once_cold_5();
  timer_check_double_call_called = timer_check_double_call_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(timer_null_callback) {
  uv_timer_t handle;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &handle));
  ASSERT_EQ(UV_EINVAL, uv_timer_start(&handle, NULL, 100, 100));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}